

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O1

int * Gia_SortGetTest(int nSize)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  srand(0);
  piVar2 = (int *)malloc((long)nSize * 4);
  if (0 < nSize) {
    uVar3 = 0;
    do {
      iVar1 = rand();
      piVar2[uVar3] = iVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)nSize != uVar3);
  }
  return piVar2;
}

Assistant:

int * Gia_SortGetTest( int nSize )
{
    int i, * pArray;
    srand( 0 );
    pArray = ABC_ALLOC( int, nSize );
    for ( i = 0; i < nSize; i++ )
        pArray[i] = rand();
    return pArray;
}